

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall trompeloeil::sequence_type::retire_until(sequence_type *this,sequence_matcher *m)

{
  sequence_matcher *psVar1;
  list_elem<trompeloeil::sequence_matcher> *plVar2;
  list_elem<trompeloeil::sequence_matcher> *plVar3;
  
  while ((psVar1 = (sequence_matcher *)
                   (this->matchers).super_list_elem<trompeloeil::sequence_matcher>.next,
         psVar1 != (sequence_matcher *)this && (psVar1 != m))) {
    plVar2 = (psVar1->super_list_elem<trompeloeil::sequence_matcher>).next;
    plVar3 = (psVar1->super_list_elem<trompeloeil::sequence_matcher>).prev;
    plVar2->prev = plVar3;
    plVar3->next = plVar2;
    (psVar1->super_list_elem<trompeloeil::sequence_matcher>).next =
         (list_elem<trompeloeil::sequence_matcher> *)psVar1;
    (psVar1->super_list_elem<trompeloeil::sequence_matcher>).prev =
         (list_elem<trompeloeil::sequence_matcher> *)psVar1;
  }
  return;
}

Assistant:

auto
  list<T, Disposer>::begin()
  const
  noexcept
  -> iterator
  {
    return iterator{next};
  }